

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_expression.hpp
# Opt level: O1

string * __thiscall
duckdb::FunctionExpression::
ToString<duckdb::BoundAggregateExpression,duckdb::Expression,duckdb::BoundOrderModifier>
          (string *__return_storage_ptr__,FunctionExpression *this,BoundAggregateExpression *entry,
          string *catalog,string *schema,string *function_name,bool is_operator,bool distinct,
          Expression *filter,BoundOrderModifier *order_bys,bool export_state,bool add_alias)

{
  pointer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer pcVar3;
  string *psVar4;
  bool bVar5;
  long lVar6;
  const_reference pvVar7;
  pointer pEVar8;
  long *plVar9;
  reference this_01;
  undefined8 *puVar10;
  ulong *puVar11;
  size_type *psVar12;
  ulong uVar13;
  undefined8 uVar14;
  size_type __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  undefined7 in_stack_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_1c0;
  undefined1 local_199 [17];
  undefined1 local_188 [16];
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  ulong local_40 [2];
  
  local_199[0] = export_state;
  if ((int)function_name == 0) {
LAB_006bf8aa:
    local_158 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_158;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    lVar6._0_1_ = (entry->super_Expression).super_BaseExpression.type;
    lVar6._1_1_ = (entry->super_Expression).super_BaseExpression.expression_class;
    lVar6._2_6_ = *(undefined6 *)&(entry->super_Expression).super_BaseExpression.field_0xa;
    if (lVar6 != 0) {
      KeywordHelper::WriteOptionallyQuoted((string *)(local_199 + 1),(string *)entry,'\"',true);
      puVar10 = (undefined8 *)::std::__cxx11::string::append(local_199 + 1);
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_1c0.field_2._M_allocated_capacity = *psVar12;
        local_1c0.field_2._8_8_ = puVar10[3];
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      }
      else {
        local_1c0.field_2._M_allocated_capacity = *psVar12;
        local_1c0._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_1c0._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_1c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if ((string *)local_199._1_8_ != (string *)(local_199 + 0x11)) {
        operator_delete((void *)local_199._1_8_);
      }
    }
    if (catalog->_M_string_length != 0) {
      KeywordHelper::WriteOptionallyQuoted((string *)(local_199 + 1),catalog,'\"',true);
      puVar10 = (undefined8 *)::std::__cxx11::string::append(local_199 + 1);
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_1c0.field_2._M_allocated_capacity = *psVar12;
        local_1c0.field_2._8_8_ = puVar10[3];
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      }
      else {
        local_1c0.field_2._M_allocated_capacity = *psVar12;
        local_1c0._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_1c0._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_1c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if ((string *)local_199._1_8_ != (string *)(local_199 + 0x11)) {
        operator_delete((void *)local_199._1_8_);
      }
    }
    KeywordHelper::WriteOptionallyQuoted(&local_1c0,schema,'\"',true);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1c0._M_dataplus._M_p);
    paVar15 = &local_1c0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != paVar15) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (is_operator) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    puVar2 = this[1].children.
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar6 = *(long *)&this[1].distinct;
    local_199._1_8_ = (string *)(local_199 + 0x11);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)(local_199 + 1),", ","");
    StringUtil::
    Join<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long,duckdb::FunctionExpression::ToString<duckdb::BoundAggregateExpression,duckdb::Expression,duckdb::BoundOrderModifier>(duckdb::BoundAggregateExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,bool,duckdb::Expression*,duckdb::BoundOrderModifier*,bool,bool)::_lambda(duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>const&)_1_>
              (&local_1c0,
               (StringUtil *)
               &this[1].children.
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)(lVar6 - (long)puVar2 >> 3),(unsigned_long)(local_199 + 1),(string *)local_199,
               (anon_class_8_1_29113bd2)function_name);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != paVar15) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    if ((string *)local_199._1_8_ != (string *)(local_199 + 0x11)) {
      operator_delete((void *)local_199._1_8_);
    }
    if ((filter != (Expression *)0x0) &&
       ((filter->super_BaseExpression).alias._M_dataplus._M_p !=
        (pointer)(filter->super_BaseExpression).alias._M_string_length)) {
      if (this[1].children.
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage == *(pointer *)&this[1].distinct) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      if ((pointer)(filter->super_BaseExpression).alias._M_string_length !=
          (filter->super_BaseExpression).alias._M_dataplus._M_p) {
        __n = 0;
        do {
          if (__n != 0) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          this_01 = vector<duckdb::BoundOrderByNode,_true>::operator[]
                              ((vector<duckdb::BoundOrderByNode,_true> *)
                               &(filter->super_BaseExpression).alias,__n);
          BoundOrderByNode::ToString_abi_cxx11_(&local_1c0,this_01);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1c0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != paVar15) {
            operator_delete(local_1c0._M_dataplus._M_p);
          }
          __n = __n + 1;
        } while (__n < (ulong)(((long)((filter->super_BaseExpression).alias._M_string_length -
                                      (long)(filter->super_BaseExpression).alias._M_dataplus._M_p)
                               >> 3) * -0x5555555555555555));
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((long *)CONCAT71(in_stack_00000011,distinct) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(in_stack_00000011,distinct) + 0x40))(&local_178);
      plVar9 = (long *)::std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x1388d03);
      puVar11 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar11) {
        local_188._0_8_ = *puVar11;
        local_188._8_8_ = plVar9[3];
        local_199._1_8_ = (string *)(local_199 + 0x11);
      }
      else {
        local_188._0_8_ = *puVar11;
        local_199._1_8_ = (ulong *)*plVar9;
      }
      local_199._9_8_ = plVar9[1];
      *plVar9 = (long)puVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      puVar10 = (undefined8 *)::std::__cxx11::string::append(local_199 + 1);
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_1c0.field_2._M_allocated_capacity = *psVar12;
        local_1c0.field_2._8_8_ = puVar10[3];
        local_1c0._M_dataplus._M_p = (pointer)paVar15;
      }
      else {
        local_1c0.field_2._M_allocated_capacity = *psVar12;
        local_1c0._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_1c0._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_1c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != paVar15) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if ((string *)local_199._1_8_ != (string *)(local_199 + 0x11)) {
        operator_delete((void *)local_199._1_8_);
      }
      if (local_178 != &local_168) {
        operator_delete(local_178);
      }
    }
    if ((char)order_bys == '\0') {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  this_00 = &this[1].children.
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  lVar6 = *(long *)&this[1].distinct -
          (long)this[1].children.
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3;
  if (lVar6 == 2) {
    paVar15 = &local_e0;
    local_f0[0] = paVar15;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"(%s %s %s)","");
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)this_00,0);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[8])(&local_70,pEVar8);
    pcVar3 = (schema->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar3,pcVar3 + schema->_M_string_length);
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)this_00,1);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[8])(&local_90,pEVar8);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_f0,&local_70,&local_110,&local_90,
               function_name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    local_50[0] = local_f0[0];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
      local_50[0] = local_f0[0];
    }
LAB_006c012d:
    if (local_50[0] == paVar15) {
      return __return_storage_ptr__;
    }
    goto LAB_006c0132;
  }
  if (lVar6 != 1) goto LAB_006bf8aa;
  paVar1 = &local_1c0.field_2;
  local_1c0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"__postfix","");
  bVar5 = StringUtil::Contains(schema,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if (!bVar5) {
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_199 + 0x11);
    pcVar3 = (schema->_M_dataplus)._M_p;
    local_199._1_8_ = paVar15;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_199 + 1),pcVar3,pcVar3 + schema->_M_string_length);
    ::std::__cxx11::string::append(local_199 + 1);
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)this_00,0);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[8])(&local_178,pEVar8);
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_199._1_8_ != paVar15) {
      uVar13 = local_188._0_8_;
    }
    if (uVar13 < (ulong)(local_170 + local_199._9_8_)) {
      uVar13 = 0xf;
      if (local_178 != &local_168) {
        uVar13 = local_168;
      }
      if (uVar13 < (ulong)(local_170 + local_199._9_8_)) goto LAB_006bfee1;
      puVar10 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,local_199._1_8_);
    }
    else {
LAB_006bfee1:
      puVar10 = (undefined8 *)::std::__cxx11::string::_M_append(local_199 + 1,(ulong)local_178);
    }
    psVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_1c0.field_2._M_allocated_capacity = *psVar12;
      local_1c0.field_2._8_8_ = puVar10[3];
      local_1c0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1c0.field_2._M_allocated_capacity = *psVar12;
      local_1c0._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_1c0._M_string_length = puVar10[1];
    *puVar10 = psVar12;
    puVar10[1] = 0;
    *(undefined1 *)psVar12 = 0;
    plVar9 = (long *)::std::__cxx11::string::append((char *)&local_1c0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar12) {
      lVar6 = plVar9[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
    }
    __return_storage_ptr__->_M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    local_50[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_199._1_8_;
    if (local_178 != &local_168) {
      operator_delete(local_178);
      local_50[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_199._1_8_;
    }
    goto LAB_006c012d;
  }
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         *)this_00,0);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[8])(local_50);
  plVar9 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1388b68);
  puVar11 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar11) {
    local_168 = *puVar11;
    lStack_160 = plVar9[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar11;
    local_178 = (ulong *)*plVar9;
  }
  local_170 = plVar9[1];
  *plVar9 = (long)puVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_178);
  psVar4 = (string *)(local_199 + 0x11);
  puVar11 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_188._0_8_ = *puVar11;
    local_188._8_8_ = puVar10[3];
    local_199._1_8_ = psVar4;
  }
  else {
    local_188._0_8_ = *puVar11;
    local_199._1_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar10;
  }
  local_199._9_8_ = puVar10[1];
  *puVar10 = puVar11;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  pcVar3 = (schema->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar3,pcVar3 + schema->_M_string_length);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"__postfix","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,anon_var_dwarf_643533f + 9);
  StringUtil::Replace(&local_150,&local_130,&local_b0,&local_d0);
  uVar13 = 0xf;
  if ((string *)local_199._1_8_ != psVar4) {
    uVar13 = local_188._0_8_;
  }
  if (uVar13 < local_150._M_string_length + local_199._9_8_) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      uVar14 = local_150.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_150._M_string_length + local_199._9_8_) goto LAB_006c004c;
    puVar10 = (undefined8 *)
              ::std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,local_199._1_8_);
  }
  else {
LAB_006c004c:
    puVar10 = (undefined8 *)
              ::std::__cxx11::string::_M_append(local_199 + 1,(ulong)local_150._M_dataplus._M_p);
  }
  psVar12 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1c0.field_2._M_allocated_capacity = *psVar12;
    local_1c0.field_2._8_8_ = puVar10[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar12;
    local_1c0._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_1c0._M_string_length = puVar10[1];
  *puVar10 = psVar12;
  puVar10[1] = 0;
  *(undefined1 *)psVar12 = 0;
  plVar9 = (long *)::std::__cxx11::string::append((char *)&local_1c0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar12) {
    lVar6 = plVar9[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
  }
  __return_storage_ptr__->_M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((string *)local_199._1_8_ != psVar4) {
    operator_delete((void *)local_199._1_8_);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_50[0] ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40) {
    return __return_storage_ptr__;
  }
LAB_006c0132:
  operator_delete(local_50[0]);
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry, const string &catalog, const string &schema, const string &function_name,
	                       bool is_operator = false, bool distinct = false, BASE *filter = nullptr,
	                       ORDER_MODIFIER *order_bys = nullptr, bool export_state = false, bool add_alias = false) {
		if (is_operator) {
			// built-in operator
			D_ASSERT(!distinct);
			if (entry.children.size() == 1) {
				if (StringUtil::Contains(function_name, "__postfix")) {
					return "((" + entry.children[0]->ToString() + ")" +
					       StringUtil::Replace(function_name, "__postfix", "") + ")";
				} else {
					return function_name + "(" + entry.children[0]->ToString() + ")";
				}
			} else if (entry.children.size() == 2) {
				return StringUtil::Format("(%s %s %s)", entry.children[0]->ToString(), function_name,
				                          entry.children[1]->ToString());
			}
		}
		// standard function call
		string result;
		if (!catalog.empty()) {
			result += KeywordHelper::WriteOptionallyQuoted(catalog) + ".";
		}
		if (!schema.empty()) {
			result += KeywordHelper::WriteOptionallyQuoted(schema) + ".";
		}
		result += KeywordHelper::WriteOptionallyQuoted(function_name);
		result += "(";
		if (distinct) {
			result += "DISTINCT ";
		}
		result += StringUtil::Join(entry.children, entry.children.size(), ", ", [&](const unique_ptr<BASE> &child) {
			return child->GetAlias().empty() || !add_alias
			           ? child->ToString()
			           : StringUtil::Format("%s := %s", SQLIdentifier(child->GetAlias()), child->ToString());
		});
		// ordered aggregate
		if (order_bys && !order_bys->orders.empty()) {
			if (entry.children.empty()) {
				result += ") WITHIN GROUP (";
			}
			result += " ORDER BY ";
			for (idx_t i = 0; i < order_bys->orders.size(); i++) {
				if (i > 0) {
					result += ", ";
				}
				result += order_bys->orders[i].ToString();
			}
		}
		result += ")";

		// filtered aggregate
		if (filter) {
			result += " FILTER (WHERE " + filter->ToString() + ")";
		}

		if (export_state) {
			result += " EXPORT_STATE";
		}

		return result;
	}